

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersector1<8,_1048576,_false,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  Geometry *this;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  bool bVar21;
  bool bVar22;
  long lVar23;
  ulong uVar24;
  ulong *puVar25;
  byte bVar26;
  byte bVar27;
  ulong *puVar28;
  ulong uVar29;
  long lVar30;
  size_t i;
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2458 [16];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  undefined1 auVar47 [32];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 == 8) {
    return false;
  }
  local_2370[0] = 0;
  auVar33 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[0]));
  auVar66 = ZEXT3264(auVar33);
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_2458 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar3 = (context->query_radius).field_0;
    local_2458 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  }
  puVar28 = local_2368;
  auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.x));
  auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.y));
  auVar36 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.z));
  auVar37 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[1]));
  auVar68 = ZEXT3264(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[2]));
  auVar70 = ZEXT3264(auVar37);
  auVar32 = vmulss_avx512f(auVar33._0_16_,auVar33._0_16_);
  auVar33._0_4_ = auVar32._0_4_;
  auVar33._4_4_ = auVar33._0_4_;
  auVar33._8_4_ = auVar33._0_4_;
  auVar33._12_4_ = auVar33._0_4_;
  auVar33._16_4_ = auVar33._0_4_;
  auVar33._20_4_ = auVar33._0_4_;
  auVar33._24_4_ = auVar33._0_4_;
  auVar33._28_4_ = auVar33._0_4_;
  bVar22 = false;
  auVar37 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
  auVar71 = ZEXT3264(auVar37);
  auVar37 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  auVar72 = ZEXT3264(auVar37);
LAB_01f2fc1e:
  auVar65 = auVar66._0_32_;
  auVar37 = vsubps_avx512vl(auVar34,auVar65);
  auVar38 = vaddps_avx512vl(auVar34,auVar65);
  auVar67 = auVar68._0_32_;
  auVar39 = vsubps_avx512vl(auVar35,auVar67);
  auVar40 = vaddps_avx512vl(auVar35,auVar67);
  auVar69 = auVar70._0_32_;
  auVar41 = vsubps_avx512vl(auVar36,auVar69);
  auVar42 = vaddps_avx512vl(auVar36,auVar69);
LAB_01f2fc42:
  pfVar1 = (float *)(puVar28 + -1);
  puVar28 = puVar28 + -2;
  if (*pfVar1 <= (float)local_2458._0_4_) {
    uVar29 = *puVar28;
    do {
      do {
        if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
          if ((uVar29 & 8) != 0) {
LAB_01f3019e:
            uVar24 = (ulong)((uint)uVar29 & 0xf);
            if (uVar24 == 8) goto LAB_01f3032f;
            lVar30 = (uVar29 & 0xfffffffffffffff0) + 0x50;
            lVar23 = 0;
            bVar26 = 0;
            goto LAB_01f301e6;
          }
          puVar25 = (ulong *)((uVar29 & 0xfffffffffffffff0) + 0x40);
          if ((uVar29 & 0xfffffffffffffff0) == 0) {
            puVar25 = (ulong *)0x0;
          }
          uVar2 = (undefined4)puVar25[6];
          auVar49._4_4_ = uVar2;
          auVar49._0_4_ = uVar2;
          auVar49._8_4_ = uVar2;
          auVar49._12_4_ = uVar2;
          auVar49._16_4_ = uVar2;
          auVar49._20_4_ = uVar2;
          auVar49._24_4_ = uVar2;
          auVar49._28_4_ = uVar2;
          uVar2 = *(undefined4 *)((long)puVar25 + 0x3c);
          auVar57._4_4_ = uVar2;
          auVar57._0_4_ = uVar2;
          auVar57._8_4_ = uVar2;
          auVar57._12_4_ = uVar2;
          auVar57._16_4_ = uVar2;
          auVar57._20_4_ = uVar2;
          auVar57._24_4_ = uVar2;
          auVar57._28_4_ = uVar2;
          auVar60._8_8_ = 0;
          auVar60._0_8_ = *puVar25;
          auVar43 = vpmovzxbd_avx2(auVar60);
          auVar43 = vcvtdq2ps_avx(auVar43);
          auVar32 = vfmadd213ps_fma(auVar43,auVar57,auVar49);
          auVar64._8_8_ = 0;
          auVar64._0_8_ = puVar25[1];
          auVar43 = vpmovzxbd_avx2(auVar64);
          auVar43 = vcvtdq2ps_avx(auVar43);
          auVar18 = vfmadd213ps_fma(auVar43,auVar57,auVar49);
          uVar2 = *(undefined4 *)((long)puVar25 + 0x34);
          auVar54._4_4_ = uVar2;
          auVar54._0_4_ = uVar2;
          auVar54._8_4_ = uVar2;
          auVar54._12_4_ = uVar2;
          auVar54._16_4_ = uVar2;
          auVar54._20_4_ = uVar2;
          auVar54._24_4_ = uVar2;
          auVar54._28_4_ = uVar2;
          uVar2 = (undefined4)puVar25[8];
          auVar58._4_4_ = uVar2;
          auVar58._0_4_ = uVar2;
          auVar58._8_4_ = uVar2;
          auVar58._12_4_ = uVar2;
          auVar58._16_4_ = uVar2;
          auVar58._20_4_ = uVar2;
          auVar58._24_4_ = uVar2;
          auVar58._28_4_ = uVar2;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = puVar25[2];
          auVar43 = vpmovzxbd_avx2(auVar4);
          auVar43 = vcvtdq2ps_avx(auVar43);
          auVar19 = vfmadd213ps_fma(auVar43,auVar58,auVar54);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = puVar25[3];
          auVar43 = vpmovzxbd_avx2(auVar5);
          auVar43 = vcvtdq2ps_avx(auVar43);
          auVar20 = vfmadd213ps_fma(auVar43,auVar58,auVar54);
          uVar2 = (undefined4)puVar25[7];
          auVar55._4_4_ = uVar2;
          auVar55._0_4_ = uVar2;
          auVar55._8_4_ = uVar2;
          auVar55._12_4_ = uVar2;
          auVar55._16_4_ = uVar2;
          auVar55._20_4_ = uVar2;
          auVar55._24_4_ = uVar2;
          auVar55._28_4_ = uVar2;
          uVar2 = *(undefined4 *)((long)puVar25 + 0x44);
          auVar59._4_4_ = uVar2;
          auVar59._0_4_ = uVar2;
          auVar59._8_4_ = uVar2;
          auVar59._12_4_ = uVar2;
          auVar59._16_4_ = uVar2;
          auVar59._20_4_ = uVar2;
          auVar59._24_4_ = uVar2;
          auVar59._28_4_ = uVar2;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = puVar25[4];
          auVar43 = vpmovzxbd_avx2(auVar6);
          auVar43 = vcvtdq2ps_avx(auVar43);
          auVar53 = vfmadd213ps_fma(auVar43,auVar59,auVar55);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = puVar25[10];
          auVar43 = vpmovzxbd_avx512vl(auVar7);
          auVar43 = vcvtdq2ps_avx512vl(auVar43);
          auVar44 = vfmadd213ps_avx512vl(auVar43,auVar59,auVar55);
          auVar43 = vmaxps_avx512vl(auVar34,ZEXT1632(auVar32));
          auVar43 = vminps_avx(auVar43,ZEXT1632(auVar18));
          auVar45 = vsubps_avx512vl(auVar43,auVar34);
          auVar43 = vmaxps_avx512vl(auVar35,ZEXT1632(auVar19));
          auVar43 = vminps_avx(auVar43,ZEXT1632(auVar20));
          auVar43 = vsubps_avx512vl(auVar43,auVar35);
          auVar46 = vmaxps_avx512vl(auVar36,ZEXT1632(auVar53));
          auVar44 = vminps_avx512vl(auVar46,auVar44);
          auVar44 = vsubps_avx512vl(auVar44,auVar36);
          auVar46._0_4_ =
               auVar44._0_4_ * auVar44._0_4_ +
               auVar43._0_4_ * auVar43._0_4_ + auVar45._0_4_ * auVar45._0_4_;
          auVar46._4_4_ =
               auVar44._4_4_ * auVar44._4_4_ +
               auVar43._4_4_ * auVar43._4_4_ + auVar45._4_4_ * auVar45._4_4_;
          auVar46._8_4_ =
               auVar44._8_4_ * auVar44._8_4_ +
               auVar43._8_4_ * auVar43._8_4_ + auVar45._8_4_ * auVar45._8_4_;
          auVar46._12_4_ =
               auVar44._12_4_ * auVar44._12_4_ +
               auVar43._12_4_ * auVar43._12_4_ + auVar45._12_4_ * auVar45._12_4_;
          auVar46._16_4_ =
               auVar44._16_4_ * auVar44._16_4_ +
               auVar43._16_4_ * auVar43._16_4_ + auVar45._16_4_ * auVar45._16_4_;
          auVar46._20_4_ =
               auVar44._20_4_ * auVar44._20_4_ +
               auVar43._20_4_ * auVar43._20_4_ + auVar45._20_4_ * auVar45._20_4_;
          auVar46._24_4_ =
               auVar44._24_4_ * auVar44._24_4_ +
               auVar43._24_4_ * auVar43._24_4_ + auVar45._24_4_ * auVar45._24_4_;
          auVar46._28_4_ = auVar43._28_4_ + auVar43._28_4_ + auVar45._28_4_;
          uVar9 = vcmpps_avx512vl(ZEXT1632(auVar32),ZEXT1632(auVar18),2);
          uVar15 = vpcmpub_avx512vl(auVar60,auVar64,2);
          uVar10 = vcmpps_avx512vl(auVar46,auVar33,2);
          bVar26 = (byte)uVar9 & (byte)uVar10 & (byte)uVar15;
        }
        else {
          if ((uVar29 & 8) != 0) goto LAB_01f3019e;
          puVar25 = (ulong *)((uVar29 & 0xfffffffffffffff0) + 0x40);
          if ((uVar29 & 0xfffffffffffffff0) == 0) {
            puVar25 = (ulong *)0x0;
          }
          auVar53._8_8_ = 0;
          auVar53._0_8_ = *puVar25;
          auVar56._8_8_ = 0;
          auVar56._0_8_ = puVar25[1];
          uVar16 = vpcmpub_avx512vl(auVar53,auVar56,2);
          uVar2 = (undefined4)puVar25[6];
          auVar47._4_4_ = uVar2;
          auVar47._0_4_ = uVar2;
          auVar47._8_4_ = uVar2;
          auVar47._12_4_ = uVar2;
          auVar47._16_4_ = uVar2;
          auVar47._20_4_ = uVar2;
          auVar47._24_4_ = uVar2;
          auVar47._28_4_ = uVar2;
          uVar2 = *(undefined4 *)((long)puVar25 + 0x3c);
          auVar50._4_4_ = uVar2;
          auVar50._0_4_ = uVar2;
          auVar50._8_4_ = uVar2;
          auVar50._12_4_ = uVar2;
          auVar50._16_4_ = uVar2;
          auVar50._20_4_ = uVar2;
          auVar50._24_4_ = uVar2;
          auVar50._28_4_ = uVar2;
          auVar43 = vpmovzxbd_avx2(auVar53);
          auVar43 = vcvtdq2ps_avx(auVar43);
          auVar53 = vfmadd213ps_fma(auVar43,auVar50,auVar47);
          auVar43 = vpmovzxbd_avx2(auVar56);
          auVar43 = vcvtdq2ps_avx(auVar43);
          auVar56 = vfmadd213ps_fma(auVar43,auVar50,auVar47);
          uVar2 = *(undefined4 *)((long)puVar25 + 0x34);
          auVar44._4_4_ = uVar2;
          auVar44._0_4_ = uVar2;
          auVar44._8_4_ = uVar2;
          auVar44._12_4_ = uVar2;
          auVar44._16_4_ = uVar2;
          auVar44._20_4_ = uVar2;
          auVar44._24_4_ = uVar2;
          auVar44._28_4_ = uVar2;
          uVar2 = (undefined4)puVar25[8];
          auVar51._4_4_ = uVar2;
          auVar51._0_4_ = uVar2;
          auVar51._8_4_ = uVar2;
          auVar51._12_4_ = uVar2;
          auVar51._16_4_ = uVar2;
          auVar51._20_4_ = uVar2;
          auVar51._24_4_ = uVar2;
          auVar51._28_4_ = uVar2;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = puVar25[2];
          auVar43 = vpmovzxbd_avx2(auVar32);
          auVar43 = vcvtdq2ps_avx(auVar43);
          auVar32 = vfmadd213ps_fma(auVar43,auVar51,auVar44);
          auVar18._8_8_ = 0;
          auVar18._0_8_ = puVar25[3];
          auVar43 = vpmovzxbd_avx2(auVar18);
          auVar43 = vcvtdq2ps_avx(auVar43);
          auVar18 = vfmadd213ps_fma(auVar43,auVar51,auVar44);
          uVar2 = (undefined4)puVar25[7];
          auVar45._4_4_ = uVar2;
          auVar45._0_4_ = uVar2;
          auVar45._8_4_ = uVar2;
          auVar45._12_4_ = uVar2;
          auVar45._16_4_ = uVar2;
          auVar45._20_4_ = uVar2;
          auVar45._24_4_ = uVar2;
          auVar45._28_4_ = uVar2;
          uVar2 = *(undefined4 *)((long)puVar25 + 0x44);
          auVar61._4_4_ = uVar2;
          auVar61._0_4_ = uVar2;
          auVar61._8_4_ = uVar2;
          auVar61._12_4_ = uVar2;
          auVar61._16_4_ = uVar2;
          auVar61._20_4_ = uVar2;
          auVar61._24_4_ = uVar2;
          auVar61._28_4_ = uVar2;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = puVar25[4];
          auVar43 = vpmovzxbd_avx2(auVar19);
          auVar43 = vcvtdq2ps_avx(auVar43);
          auVar19 = vfmadd213ps_fma(auVar43,auVar61,auVar45);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = puVar25[5];
          auVar43 = vpmovzxbd_avx2(auVar20);
          auVar43 = vcvtdq2ps_avx(auVar43);
          auVar20 = vfmadd213ps_fma(auVar43,auVar61,auVar45);
          auVar47 = ZEXT1632(auVar53);
          auVar43 = vmaxps_avx512vl(auVar34,auVar47);
          auVar43 = vminps_avx(auVar43,ZEXT1632(auVar56));
          auVar44 = vsubps_avx512vl(auVar43,auVar34);
          auVar43 = vmaxps_avx512vl(auVar35,ZEXT1632(auVar32));
          auVar43 = vminps_avx(auVar43,ZEXT1632(auVar18));
          auVar45 = vsubps_avx512vl(auVar43,auVar35);
          auVar43 = vmaxps_avx512vl(auVar36,ZEXT1632(auVar19));
          auVar43 = vminps_avx(auVar43,ZEXT1632(auVar20));
          auVar43 = vsubps_avx512vl(auVar43,auVar36);
          auVar46._0_4_ =
               auVar43._0_4_ * auVar43._0_4_ +
               auVar45._0_4_ * auVar45._0_4_ + auVar44._0_4_ * auVar44._0_4_;
          auVar46._4_4_ =
               auVar43._4_4_ * auVar43._4_4_ +
               auVar45._4_4_ * auVar45._4_4_ + auVar44._4_4_ * auVar44._4_4_;
          auVar46._8_4_ =
               auVar43._8_4_ * auVar43._8_4_ +
               auVar45._8_4_ * auVar45._8_4_ + auVar44._8_4_ * auVar44._8_4_;
          auVar46._12_4_ =
               auVar43._12_4_ * auVar43._12_4_ +
               auVar45._12_4_ * auVar45._12_4_ + auVar44._12_4_ * auVar44._12_4_;
          auVar46._16_4_ =
               auVar43._16_4_ * auVar43._16_4_ +
               auVar45._16_4_ * auVar45._16_4_ + auVar44._16_4_ * auVar44._16_4_;
          auVar46._20_4_ =
               auVar43._20_4_ * auVar43._20_4_ +
               auVar45._20_4_ * auVar45._20_4_ + auVar44._20_4_ * auVar44._20_4_;
          auVar46._24_4_ =
               auVar43._24_4_ * auVar43._24_4_ +
               auVar45._24_4_ * auVar45._24_4_ + auVar44._24_4_ * auVar44._24_4_;
          auVar46._28_4_ = auVar45._28_4_ + auVar45._28_4_ + auVar44._28_4_;
          uVar9 = vcmpps_avx512vl(ZEXT1632(auVar56),auVar37,1);
          uVar10 = vcmpps_avx512vl(auVar47,auVar38,6);
          uVar15 = vcmpps_avx512vl(ZEXT1632(auVar32),auVar40,6);
          uVar11 = vcmpps_avx512vl(ZEXT1632(auVar18),auVar39,1);
          uVar12 = vcmpps_avx512vl(ZEXT1632(auVar20),auVar41,1);
          uVar13 = vcmpps_avx512vl(ZEXT1632(auVar19),auVar42,6);
          uVar14 = vcmpps_avx512vl(auVar47,ZEXT1632(auVar56),2);
          bVar26 = (byte)uVar16 & (byte)uVar14 &
                   ~((byte)uVar10 | (byte)uVar9 | (byte)uVar15 | (byte)uVar11 | (byte)uVar13 |
                    (byte)uVar12);
        }
        if (bVar26 == 0) {
          if (puVar28 == &local_2378) {
            return bVar22;
          }
          goto LAB_01f2fc42;
        }
        auVar43 = *(undefined1 (*) [32])(uVar29 & 0xfffffffffffffff0);
        auVar44 = ((undefined1 (*) [32])(uVar29 & 0xfffffffffffffff0))[1];
        auVar45 = vmovdqa64_avx512vl(auVar71._0_32_);
        auVar45 = vpternlogd_avx512vl(auVar45,auVar46,auVar72._0_32_,0xf8);
        auVar47 = vpcompressd_avx512vl(auVar45);
        auVar48._0_4_ =
             (uint)(bVar26 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar45._0_4_;
        bVar21 = (bool)(bVar26 >> 1 & 1);
        auVar48._4_4_ = (uint)bVar21 * auVar47._4_4_ | (uint)!bVar21 * auVar45._4_4_;
        bVar21 = (bool)(bVar26 >> 2 & 1);
        auVar48._8_4_ = (uint)bVar21 * auVar47._8_4_ | (uint)!bVar21 * auVar45._8_4_;
        bVar21 = (bool)(bVar26 >> 3 & 1);
        auVar48._12_4_ = (uint)bVar21 * auVar47._12_4_ | (uint)!bVar21 * auVar45._12_4_;
        bVar21 = (bool)(bVar26 >> 4 & 1);
        auVar48._16_4_ = (uint)bVar21 * auVar47._16_4_ | (uint)!bVar21 * auVar45._16_4_;
        bVar21 = (bool)(bVar26 >> 5 & 1);
        auVar48._20_4_ = (uint)bVar21 * auVar47._20_4_ | (uint)!bVar21 * auVar45._20_4_;
        bVar21 = (bool)(bVar26 >> 6 & 1);
        auVar48._24_4_ = (uint)bVar21 * auVar47._24_4_ | (uint)!bVar21 * auVar45._24_4_;
        auVar48._28_4_ =
             (uint)(bVar26 >> 7) * auVar47._28_4_ | (uint)!(bool)(bVar26 >> 7) * auVar45._28_4_;
        auVar45 = vpermt2q_avx512vl(auVar43,auVar48,auVar44);
        uVar29 = auVar45._0_8_;
        bVar26 = bVar26 - 1 & bVar26;
      } while (bVar26 == 0);
      auVar45 = vpshufd_avx2(auVar48,0x55);
      vpermt2q_avx512vl(auVar43,auVar45,auVar44);
      auVar47 = vpminsd_avx2(auVar48,auVar45);
      auVar45 = vpmaxsd_avx2(auVar48,auVar45);
      bVar26 = bVar26 - 1 & bVar26;
      if (bVar26 == 0) {
        auVar47 = vpermi2q_avx512vl(auVar47,auVar43,auVar44);
        uVar29 = auVar47._0_8_;
        auVar43 = vpermt2q_avx512vl(auVar43,auVar45,auVar44);
        *puVar28 = auVar43._0_8_;
        auVar43 = vpermd_avx2(auVar45,auVar46);
        *(int *)(puVar28 + 1) = auVar43._0_4_;
        puVar28 = puVar28 + 2;
      }
      else {
        auVar61 = vpshufd_avx2(auVar48,0xaa);
        vpermt2q_avx512vl(auVar43,auVar61,auVar44);
        auVar51 = vpminsd_avx2(auVar47,auVar61);
        auVar47 = vpmaxsd_avx2(auVar47,auVar61);
        auVar61 = vpminsd_avx2(auVar45,auVar47);
        auVar45 = vpmaxsd_avx2(auVar45,auVar47);
        bVar26 = bVar26 - 1 & bVar26;
        if (bVar26 == 0) {
          auVar47 = vpermi2q_avx512vl(auVar51,auVar43,auVar44);
          uVar29 = auVar47._0_8_;
          auVar47 = vpermt2q_avx512vl(auVar43,auVar45,auVar44);
          *puVar28 = auVar47._0_8_;
          auVar45 = vpermd_avx2(auVar45,auVar46);
          *(int *)(puVar28 + 1) = auVar45._0_4_;
          auVar43 = vpermt2q_avx512vl(auVar43,auVar61,auVar44);
          puVar28[2] = auVar43._0_8_;
          auVar43 = vpermd_avx2(auVar61,auVar46);
          *(int *)(puVar28 + 3) = auVar43._0_4_;
          puVar28 = puVar28 + 4;
        }
        else {
          auVar47 = vpshufd_avx2(auVar48,0xff);
          vpermt2q_avx512vl(auVar43,auVar47,auVar44);
          auVar50 = vpminsd_avx2(auVar51,auVar47);
          auVar47 = vpmaxsd_avx2(auVar51,auVar47);
          auVar51 = vpminsd_avx2(auVar61,auVar47);
          auVar47 = vpmaxsd_avx2(auVar61,auVar47);
          auVar61 = vpminsd_avx2(auVar45,auVar47);
          auVar45 = vpmaxsd_avx2(auVar45,auVar47);
          bVar26 = bVar26 - 1 & bVar26;
          if (bVar26 == 0) {
            auVar47 = vpermi2q_avx512vl(auVar50,auVar43,auVar44);
            uVar29 = auVar47._0_8_;
            auVar47 = vpermt2q_avx512vl(auVar43,auVar45,auVar44);
            *puVar28 = auVar47._0_8_;
            auVar45 = vpermd_avx2(auVar45,auVar46);
            *(int *)(puVar28 + 1) = auVar45._0_4_;
            auVar45 = vpermt2q_avx512vl(auVar43,auVar61,auVar44);
            puVar28[2] = auVar45._0_8_;
            auVar45 = vpermd_avx2(auVar61,auVar46);
            *(int *)(puVar28 + 3) = auVar45._0_4_;
            auVar43 = vpermt2q_avx512vl(auVar43,auVar51,auVar44);
            puVar28[4] = auVar43._0_8_;
            auVar43 = vpermd_avx2(auVar51,auVar46);
            *(int *)(puVar28 + 5) = auVar43._0_4_;
            puVar28 = puVar28 + 6;
          }
          else {
            auVar49 = valignd_avx512vl(auVar48,auVar48,3);
            auVar47 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
            auVar50 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                           CONCAT48(0x80000000,0x8000000080000000)))
                                        ,auVar47,auVar50);
            auVar47 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
            auVar51 = vpermt2d_avx512vl(auVar50,auVar47,auVar51);
            auVar51 = vpermt2d_avx512vl(auVar51,auVar47,auVar61);
            auVar47 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
            auVar45 = vpermt2d_avx512vl(auVar51,auVar47,auVar45);
            auVar63 = ZEXT3264(auVar45);
            bVar27 = bVar26;
            do {
              auVar47 = auVar63._0_32_;
              auVar62._8_4_ = 1;
              auVar62._0_8_ = 0x100000001;
              auVar62._12_4_ = 1;
              auVar62._16_4_ = 1;
              auVar62._20_4_ = 1;
              auVar62._24_4_ = 1;
              auVar62._28_4_ = 1;
              auVar45 = vpermd_avx2(auVar62,auVar49);
              auVar49 = valignd_avx512vl(auVar49,auVar49,1);
              vpermt2q_avx512vl(auVar43,auVar49,auVar44);
              bVar27 = bVar27 - 1 & bVar27;
              uVar9 = vpcmpd_avx512vl(auVar45,auVar47,5);
              auVar45 = vpmaxsd_avx2(auVar45,auVar47);
              bVar17 = (byte)uVar9 << 1;
              auVar47 = valignd_avx512vl(auVar47,auVar47,7);
              bVar21 = (bool)((byte)uVar9 & 1);
              auVar52._4_4_ = (uint)bVar21 * auVar47._4_4_ | (uint)!bVar21 * auVar45._4_4_;
              auVar52._0_4_ = auVar45._0_4_;
              bVar21 = (bool)(bVar17 >> 2 & 1);
              auVar52._8_4_ = (uint)bVar21 * auVar47._8_4_ | (uint)!bVar21 * auVar45._8_4_;
              bVar21 = (bool)(bVar17 >> 3 & 1);
              auVar52._12_4_ = (uint)bVar21 * auVar47._12_4_ | (uint)!bVar21 * auVar45._12_4_;
              bVar21 = (bool)(bVar17 >> 4 & 1);
              auVar52._16_4_ = (uint)bVar21 * auVar47._16_4_ | (uint)!bVar21 * auVar45._16_4_;
              bVar21 = (bool)(bVar17 >> 5 & 1);
              auVar52._20_4_ = (uint)bVar21 * auVar47._20_4_ | (uint)!bVar21 * auVar45._20_4_;
              bVar21 = (bool)(bVar17 >> 6 & 1);
              auVar52._24_4_ = (uint)bVar21 * auVar47._24_4_ | (uint)!bVar21 * auVar45._24_4_;
              auVar52._28_4_ =
                   (uint)(bVar17 >> 7) * auVar47._28_4_ |
                   (uint)!(bool)(bVar17 >> 7) * auVar45._28_4_;
              auVar63 = ZEXT3264(auVar52);
            } while (bVar27 != 0);
            lVar23 = (ulong)(uint)POPCOUNT((uint)bVar26) + 3;
            do {
              auVar45 = vpermi2q_avx512vl(auVar52,auVar43,auVar44);
              *puVar28 = auVar45._0_8_;
              auVar47 = auVar63._0_32_;
              auVar45 = vpermd_avx2(auVar47,auVar46);
              *(int *)(puVar28 + 1) = auVar45._0_4_;
              auVar52 = valignd_avx512vl(auVar47,auVar47,1);
              puVar28 = puVar28 + 2;
              auVar63 = ZEXT3264(auVar52);
              lVar23 = lVar23 + -1;
            } while (lVar23 != 0);
            auVar43 = vpermt2q_avx512vl(auVar43,auVar52,auVar44);
            uVar29 = auVar43._0_8_;
          }
        }
      }
    } while( true );
  }
  goto LAB_01f3032f;
LAB_01f301e6:
  do {
    bVar27 = 0;
    lVar31 = 0;
    do {
      if (*(int *)(lVar30 + lVar31 * 4) == -1) break;
      uVar8 = *(uint *)(lVar30 + -0x10 + lVar31 * 4);
      this = (context->scene->geometries).items[uVar8].ptr;
      context->geomID = uVar8;
      context->primID = *(uint *)(lVar30 + lVar31 * 4);
      bVar21 = Geometry::pointQuery(this,query,context);
      bVar27 = bVar27 | bVar21;
      lVar31 = lVar31 + 1;
    } while (lVar31 != 4);
    bVar26 = bVar26 | bVar27;
    lVar23 = lVar23 + 1;
    lVar30 = lVar30 + 0x60;
  } while (lVar23 != uVar24 - 8);
  if (bVar26 == 0) {
    auVar66 = ZEXT3264(auVar65);
    auVar68 = ZEXT3264(auVar67);
    auVar70 = ZEXT3264(auVar69);
    auVar33 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar71 = ZEXT3264(auVar33);
    auVar33 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar72 = ZEXT3264(auVar33);
  }
  else {
    auVar33 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[0]));
    auVar66 = ZEXT3264(auVar33);
    auVar33 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[1]));
    auVar68 = ZEXT3264(auVar33);
    auVar33 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[2]));
    auVar70 = ZEXT3264(auVar33);
    auVar33 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar71 = ZEXT3264(auVar33);
    auVar33 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar72 = ZEXT3264(auVar33);
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_2458 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar3 = (context->query_radius).field_0;
      local_2458 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
    }
    bVar22 = true;
  }
LAB_01f3032f:
  auVar33 = vmulps_avx512vl(auVar66._0_32_,auVar66._0_32_);
  if (puVar28 == &local_2378) {
    return bVar22;
  }
  goto LAB_01f2fc1e;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }